

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O1

void device_cleanup(void)

{
  rtcReleaseScene(embree::data);
  embree::data = 0;
  rtcReleaseScene(DAT_002d0d30);
  DAT_002d0d30 = 0;
  rtcReleaseScene(DAT_002d0d38);
  DAT_002d0d38 = 0;
  rtcReleaseScene(DAT_002d0d40);
  DAT_002d0d40 = 0;
  rtcReleaseDevice(g_device);
  g_device = (RTCDevice)0x0;
  embree::alignedUSMFree(DAT_002d0d50);
  DAT_002d0d50 = (void *)0x0;
  embree::alignedUSMFree(DAT_002d0d58);
  DAT_002d0d58 = (void *)0x0;
  embree::alignedUSMFree(DAT_002d0d60);
  DAT_002d0d60 = (void *)0x0;
  embree::alignedUSMFree(DAT_002d0d88);
  DAT_002d0d88 = (void *)0x0;
  return;
}

Assistant:

void device_cleanup ()
{
  TutorialData_Destructor(&data);
}